

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

errr grab_name(char *from,char *what,char **list,int max,int *num)

{
  int iVar1;
  int local_3c;
  int i;
  int *num_local;
  int max_local;
  char **list_local;
  char *what_local;
  char *from_local;
  
  local_3c = 0;
  while( true ) {
    if (max <= local_3c) {
      msg("Unknown %s \'%s\'.",from,what);
      return 4;
    }
    iVar1 = strcmp(what,list[local_3c]);
    if (iVar1 == 0) break;
    local_3c = local_3c + 1;
  }
  *num = local_3c;
  return 0;
}

Assistant:

errr grab_name(const char *from, const char *what, const char *list[], int max,
			   int *num)
{
	int i;

	/* Scan list */
	for (i = 0; i < max; i++) {
		if (streq(what, list[i])) {
			*num = i;
			return PARSE_ERROR_NONE;
		}
	}

	/* Oops */
	msg("Unknown %s '%s'.", from, what);

	/* Error */
	return PARSE_ERROR_GENERIC;
}